

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPointSizeTests.cpp
# Opt level: O1

TestStatus *
vkt::tessellation::anon_unknown_1::test
          (TestStatus *__return_storage_ptr__,Context *context,Flags flags)

{
  deUint32 dVar1;
  deUint32 *pdVar2;
  TestLog *pTVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkBuffer buffer;
  VkBuffer obj;
  long lVar5;
  Allocation *pAVar6;
  undefined8 commandBuffer;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int i;
  uint uVar10;
  deUint32 dVar11;
  int iVar12;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  TextureFormat format;
  const_iterator cVar13;
  GraphicsPipelineBuilder *pGVar14;
  ulong uVar15;
  long lVar16;
  NotSupportedError *this;
  bool bVar17;
  ConstPixelBufferAccess *access;
  ulong uVar18;
  void *__buf;
  int z;
  TestStatus *pTVar19;
  uint uVar20;
  VkDeviceSize bufferSize;
  int y;
  int iVar21;
  deUint32 dVar22;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  IVec2 renderSize;
  Vec4 clearColor;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_680;
  void *local_670;
  TestStatus *local_668;
  IVec2 pointSize;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_650;
  int local_640 [2];
  Image colorAttachmentImage;
  Vec4 black;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  VkRenderPass local_5e8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_5e0;
  Buffer colorBuffer;
  float local_588 [2];
  float fStack_580;
  float fStack_57c;
  undefined4 local_578;
  undefined4 local_56c;
  void *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined4 local_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined4 local_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined4 local_520;
  VkPipeline local_518;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_510;
  VkCommandPool local_4f8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_4f0;
  VkPipelineLayout local_4d8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_4d0;
  VkFramebuffer local_4b8;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_4b0;
  VkImageView local_498;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_490;
  VkPhysicalDeviceProperties properties;
  GraphicsPipelineBuilder local_138;
  
  uVar20 = 6;
  if ((flags & 8) == 0) {
    uVar10 = flags >> 3 & 2;
    if ((flags & 2) == 0) {
      uVar20 = 0xffffffff;
      if ((flags & 1) != 0) {
        uVar20 = (flags >> 1 & 2) + uVar10 + 2;
      }
    }
    else {
      uVar20 = uVar10 | 4;
    }
  }
  local_668 = __return_storage_ptr__;
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,0x23);
  colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_
       = uVar20;
  ::vk::getPhysicalDeviceProperties(&properties,vki,physDevice);
  if ((int)properties.limits.pointSizeRange[1] <
      (int)(uint)colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>((string *)&colorAttachmentImage,(int *)&colorBuffer);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138,
                   "Test requires point size ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &colorAttachmentImage);
    tcu::NotSupportedError::NotSupportedError(this,(string *)&local_138);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar3 = context->m_testCtx->m_log;
  if ((flags & 1) != 0) {
    pdVar2 = &properties.vendorID;
    properties._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar2,"Setting point size in vertex shader to 2.0.",0x2b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  }
  if ((flags & 2) != 0) {
    pdVar2 = &properties.vendorID;
    properties._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar2,"Setting point size in tessellation evaluation shader to 4.0.",0x3c
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  }
  if ((flags & 4) != 0) {
    pdVar2 = &properties.vendorID;
    properties._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar2,
               "Reading point size in tessellation control shader and adding 2.0 to it in evaluation."
               ,0x55);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  }
  if ((flags & 8) != 0) {
    pdVar2 = &properties.vendorID;
    properties._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar2,"Setting point size in geometry shader to 6.0.",0x2d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  }
  if ((flags & 0x10) != 0) {
    pdVar2 = &properties.vendorID;
    properties._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar2,"Reading point size in geometry shader and adding 2.0.",0x35);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  }
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  dVar11 = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  renderSize.m_data[0] = 0x20;
  renderSize.m_data[1] = 0x20;
  makeImageCreateInfo((VkImageCreateInfo *)&properties,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  Image::Image(&colorAttachmentImage,vk,device,allocator,(VkImageCreateInfo *)&properties,
               (MemoryRequirement)0x0);
  iVar21 = renderSize.m_data[1] * renderSize.m_data[0];
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar12 = tcu::getPixelSize(format);
  bufferSize = (VkDeviceSize)(iVar21 * iVar12);
  makeBufferCreateInfo((VkBufferCreateInfo *)&properties,bufferSize,2);
  tessellation::Buffer::Buffer
            (&colorBuffer,vk,device,allocator,(VkBufferCreateInfo *)&properties,
             (MemoryRequirement)0x1);
  local_530 = 1;
  uStack_528 = 1;
  local_520 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  DStack_490.m_device = (VkDevice)properties._16_8_;
  DStack_490.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_498.m_internal._0_4_ = properties.apiVersion;
  local_498.m_internal._4_4_ = properties.driverVersion;
  DStack_490.m_deviceIface = (DeviceInterface *)properties._8_8_;
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&properties,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  DStack_5e0.m_device = (VkDevice)properties._16_8_;
  DStack_5e0.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_5e8.m_internal._0_4_ = properties.apiVersion;
  local_5e8.m_internal._4_4_ = properties.driverVersion;
  DStack_5e0.m_deviceIface = (DeviceInterface *)properties._8_8_;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&properties,vk,device,
                  (VkRenderPass)properties._0_8_,local_498,renderSize.m_data[0],renderSize.m_data[1]
                  ,1);
  DStack_4b0.m_device = (VkDevice)properties._16_8_;
  DStack_4b0.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_4b8.m_internal._0_4_ = properties.apiVersion;
  local_4b8.m_internal._4_4_ = properties.driverVersion;
  DStack_4b0.m_deviceIface = (DeviceInterface *)properties._8_8_;
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&properties,vk,device);
  DStack_4d0.m_device = (VkDevice)properties._16_8_;
  DStack_4d0.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_4d8.m_internal._0_4_ = properties.apiVersion;
  local_4d8.m_internal._4_4_ = properties.driverVersion;
  DStack_4d0.m_deviceIface = (DeviceInterface *)properties._8_8_;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&properties,vk,device,dVar11);
  DStack_4f0.m_device = (VkDevice)properties._16_8_;
  DStack_4f0.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_4f8.m_internal._0_4_ = properties.apiVersion;
  local_4f8.m_internal._4_4_ = properties.driverVersion;
  DStack_4f0.m_deviceIface = (DeviceInterface *)properties._8_8_;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&properties,vk,device,(VkCommandPool)properties._0_8_,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uVar9 = properties.deviceName._4_8_;
  uVar8 = properties._16_8_;
  uVar7 = properties._8_8_;
  commandBuffer = properties._0_8_;
  memset(&local_138,0,0xfc);
  local_138.m_patchControlPoints = 1;
  local_138.m_blendEnable = false;
  local_138.m_primitiveTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_138.m_renderSize.m_data = renderSize.m_data;
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  properties._0_8_ = &properties.deviceType;
  std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"vert","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)&properties);
  pGVar14 = GraphicsPipelineBuilder::setShader
                      (&local_138,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                       *(ProgramBinary **)(cVar13._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  clearColor.m_data._0_8_ = &local_680;
  std::__cxx11::string::_M_construct<char_const*>((string *)&clearColor,"frag","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)&clearColor);
  GraphicsPipelineBuilder::setShader
            (pGVar14,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,*(ProgramBinary **)(cVar13._M_node + 2),
             (VkSpecializationInfo *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)clearColor.m_data._0_8_ != &local_680) {
    operator_delete((void *)clearColor.m_data._0_8_,
                    CONCAT44(local_680._M_allocated_capacity._4_4_,
                             local_680._M_allocated_capacity._0_4_) + 1);
  }
  if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
    operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
  }
  if ((flags & 6) != 0) {
    p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)context->m_progCollection;
    properties._0_8_ = &properties.deviceType;
    std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"tesc","");
    cVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var4,(key_type *)&properties);
    pGVar14 = GraphicsPipelineBuilder::setShader
                        (&local_138,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                         *(ProgramBinary **)(cVar13._M_node + 2),(VkSpecializationInfo *)0x0);
    p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)context->m_progCollection;
    clearColor.m_data._0_8_ = &local_680;
    std::__cxx11::string::_M_construct<char_const*>((string *)&clearColor,"tese","");
    cVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var4,(key_type *)&clearColor);
    GraphicsPipelineBuilder::setShader
              (pGVar14,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
               *(ProgramBinary **)(cVar13._M_node + 2),(VkSpecializationInfo *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)clearColor.m_data._0_8_ != &local_680) {
      operator_delete((void *)clearColor.m_data._0_8_,
                      CONCAT44(local_680._M_allocated_capacity._4_4_,
                               local_680._M_allocated_capacity._0_4_) + 1);
    }
    if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
      operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
    }
  }
  if ((flags & 0x18) != 0) {
    p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)context->m_progCollection;
    properties._0_8_ = &properties.deviceType;
    std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"geom","");
    cVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var4,(key_type *)&properties);
    GraphicsPipelineBuilder::setShader
              (&local_138,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
               *(ProgramBinary **)(cVar13._M_node + 2),(VkSpecializationInfo *)0x0);
    if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
      operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
    }
  }
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&properties,&local_138,vk,device,local_4d8,
             local_5e8);
  DStack_510.m_device = (VkDevice)properties._16_8_;
  DStack_510.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_518.m_internal._0_4_ = properties.apiVersion;
  local_518.m_internal._4_4_ = properties.driverVersion;
  DStack_510.m_deviceIface = (DeviceInterface *)properties._8_8_;
  beginCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
  local_548 = 1;
  uStack_540 = 1;
  local_538 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&properties,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,1,0x80,0,0,0,0,0,1,(int)&properties);
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = renderSize.m_data[0];
  properties.deviceID = renderSize.m_data[1];
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 1.0;
  beginRenderPass(vk,(VkCommandBuffer)commandBuffer,local_5e8,local_4b8,(VkRect2D *)&properties,
                  &clearColor);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,0,local_518.m_internal);
  (*vk->_vptr_DeviceInterface[0x59])(vk,commandBuffer,1,1,0,0);
  endRenderPass(vk,(VkCommandBuffer)commandBuffer);
  local_560 = 1;
  uStack_558 = 1;
  local_550 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&properties,0x100,0x800,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x400,0x1000,0,0,0,0,0,1,(int)&properties);
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)&properties,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,commandBuffer,
             colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
             object.m_internal,6,
             CONCAT44(colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                      object.m_internal._4_4_,
                      (uint)colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                            m_data.object.m_internal),1,(int)&properties);
  buffer.m_internal._4_4_ =
       colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
       _4_4_;
  buffer.m_internal._0_4_ =
       (uint)colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal;
  makeBufferMemoryBarrier((VkBufferMemoryBarrier *)&properties,0x1000,0x2000,buffer,0,bufferSize);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x1000,0x4000,0,0,0,1,&properties,0,0);
  endCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
  submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)commandBuffer);
  pAVar6 = colorBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((colorBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  properties._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&clearColor,(TextureFormat *)&properties,renderSize.m_data[0]
             ,renderSize.m_data[1],1,pAVar6->m_hostPtr);
  pTVar3 = context->m_testCtx->m_log;
  black.m_data._0_8_ = &local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&black,"color0","");
  pointSize.m_data = (int  [2])&local_650;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pointSize,"");
  access = (ConstPixelBufferAccess *)&clearColor;
  tcu::LogImage::LogImage
            ((LogImage *)&properties,(string *)&black,(string *)&pointSize,access,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&properties,(int)pTVar3,__buf,(size_t)access);
  if ((char *)properties.deviceName._12_8_ != properties.deviceName + 0x1c) {
    operator_delete((void *)properties.deviceName._12_8_,properties.deviceName._28_8_ + 1);
  }
  if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
    operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
  }
  if (pointSize.m_data != (int  [2])&local_650) {
    operator_delete((void *)pointSize.m_data,local_650._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)black.m_data._0_8_ != &local_5f8) {
    operator_delete((void *)black.m_data._0_8_,local_5f8._M_allocated_capacity + 1);
  }
  local_588[0] = clearColor.m_data[0];
  local_588[1] = clearColor.m_data[1];
  fStack_580 = clearColor.m_data[2];
  fStack_57c = clearColor.m_data[3];
  local_578 = local_680._M_allocated_capacity._0_4_;
  local_56c = local_680._12_4_;
  local_568 = local_670;
  pdVar2 = &properties.vendorID;
  properties._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pdVar2,"Verifying rendered point size. Expecting ",0x29);
  std::ostream::operator<<(pdVar2,uVar20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar2," pixels.",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  black.m_data[0] = 0.0;
  black.m_data[1] = 0.0;
  black.m_data[2] = 0.0;
  black.m_data[3] = 1.0;
  if ((int)fStack_57c < 1) {
    dVar22 = 0;
    dVar11 = 0;
    iVar12 = 0;
    iVar21 = 0;
    bVar17 = false;
  }
  else {
    z = 0;
    bVar17 = false;
    iVar21 = 0;
    iVar12 = 0;
    dVar11 = 0;
    dVar22 = 0;
    do {
      if (0 < (int)fStack_580) {
        dVar1 = z + 1;
        y = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&properties,(int)local_588,y,z);
          if (((float)properties.apiVersion != 0.0) || (NAN((float)properties.apiVersion))) {
LAB_007ad656:
            if (bVar17) {
              if (y <= iVar21) {
                iVar21 = y;
              }
              if (z <= iVar12) {
                iVar12 = z;
              }
              if ((int)dVar11 <= (int)(y + 1U)) {
                dVar11 = y + 1U;
              }
              if ((int)dVar22 <= (int)dVar1) {
                dVar22 = dVar1;
              }
            }
            else {
              dVar11 = y + 1;
              bVar17 = true;
              iVar21 = y;
              iVar12 = z;
              dVar22 = dVar1;
            }
          }
          else {
            uVar15 = 0xffffffffffffffff;
            while (uVar15 != 2) {
              lVar16 = uVar15 * 4;
              uVar18 = uVar15 + 1;
              lVar5 = uVar15 + 2;
              if ((*(float *)(properties.deviceName + lVar16 + -0xc) != black.m_data[lVar5]) ||
                 (uVar15 = uVar18,
                 NAN(*(float *)(properties.deviceName + lVar16 + -0xc)) || NAN(black.m_data[lVar5]))
                 ) goto LAB_007ad650;
            }
            uVar18 = 3;
LAB_007ad650:
            if (uVar18 < 3) goto LAB_007ad656;
          }
          y = y + 1;
        } while (y < (int)fStack_580);
      }
      z = z + 1;
    } while (z < (int)fStack_57c);
  }
  if (bVar17) {
    properties.driverVersion = dVar22;
    properties.apiVersion = dVar11;
    local_640[0] = iVar21;
    local_640[1] = iVar12;
    pointSize.m_data[0] = 0;
    pointSize.m_data[1] = 0;
    lVar16 = 0;
    do {
      pointSize.m_data[lVar16] =
           *(int *)(properties.deviceName + lVar16 * 4 + -0x14) - local_640[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar16 == 1);
    if (pointSize.m_data[0] == pointSize.m_data[1]) {
      if (pointSize.m_data[0] == uVar20) {
        properties._0_8_ = &properties.deviceType;
        std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"OK","");
        pTVar19 = local_668;
        local_668->m_code = QP_TEST_RESULT_PASS;
        (local_668->m_description)._M_dataplus._M_p = (pointer)&(local_668->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_668->m_description,properties._0_8_,
                   properties._8_8_ + properties._0_8_);
        goto LAB_007ad91c;
      }
      pdVar2 = &properties.vendorID;
      properties._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pdVar2,"ERROR! Point size invalid, expected ",0x24);
      std::ostream::operator<<(pdVar2,uVar20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar2,", got ",6);
      std::ostream::operator<<(pdVar2,pointSize.m_data[0]);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      pdVar2 = &properties.vendorID;
      properties._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pdVar2,"ERROR! Rasterized point is not a square. Point size was ",0x38);
      tcu::operator<<((ostream *)pdVar2,&pointSize);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    properties._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&properties.vendorID);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&properties.vendorID,
               "Verification failed, could not find any point fragments.",0x38);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&properties.vendorID);
  std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
  pTVar19 = local_668;
  properties._0_8_ = &properties.deviceType;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&properties,"Didn\'t render expected point","");
  pTVar19->m_code = QP_TEST_RESULT_FAIL;
  (pTVar19->m_description)._M_dataplus._M_p = (pointer)&(pTVar19->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar19->m_description,properties._0_8_,properties._8_8_ + properties._0_8_)
  ;
LAB_007ad91c:
  if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
    operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
  }
  if (local_518.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_510,local_518);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_138);
  if (commandBuffer != 0) {
    properties._0_8_ = commandBuffer;
    (**(code **)(*(long *)uVar7 + 0x240))(uVar7,uVar8,uVar9,1);
  }
  if (local_4f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_4f0,local_4f8);
  }
  if (local_4d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_4d0,local_4d8);
  }
  if (local_4b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_4b0,local_4b8);
  }
  if (local_5e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_5e0,local_5e8);
  }
  if (local_498.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_490,local_498);
  }
  if (colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
      .m_data.ptr != (Allocation *)0x0) {
    (*(colorBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  obj.m_internal._4_4_ =
       colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
       _4_4_;
  obj.m_internal._0_4_ =
       (uint)colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               obj);
  }
  if (colorAttachmentImage.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorAttachmentImage.m_allocation.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
      m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                deleter,(VkImage)colorAttachmentImage.m_image.
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                 m_internal);
  }
  return pTVar19;
}

Assistant:

tcu::TestStatus test (Context& context, const Flags flags)
{
	const int expectedPointSize = getExpectedPointSize(flags);
	{
		const InstanceInterface& vki        = context.getInstanceInterface();
		const VkPhysicalDevice   physDevice = context.getPhysicalDevice();

		requireFeatures           (vki, physDevice, FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER | FEATURE_SHADER_TESSELLATION_AND_GEOMETRY_POINT_SIZE);
		checkPointSizeRequirements(vki, physDevice, expectedPointSize);
	}
	{
		tcu::TestLog& log = context.getTestContext().getLog();

		if (flags & FLAG_VERTEX_SET)
			log << tcu::TestLog::Message << "Setting point size in vertex shader to 2.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_TESSELLATION_EVALUATION_SET)
			log << tcu::TestLog::Message << "Setting point size in tessellation evaluation shader to 4.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_TESSELLATION_ADD)
			log << tcu::TestLog::Message << "Reading point size in tessellation control shader and adding 2.0 to it in evaluation." << tcu::TestLog::EndMessage;
		if (flags & FLAG_GEOMETRY_SET)
			log << tcu::TestLog::Message << "Setting point size in geometry shader to 6.0." << tcu::TestLog::EndMessage;
		if (flags & FLAG_GEOMETRY_ADD)
			log << tcu::TestLog::Message << "Reading point size in geometry shader and adding 2.0." << tcu::TestLog::EndMessage;
	}

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer

	const VkDeviceSize	colorBufferSizeBytes = renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer          (vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView(makeImageView						(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass						(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer						(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayoutWithoutDescriptors(vk, device));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool						(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer				(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	GraphicsPipelineBuilder			pipelineBuilder;

	pipelineBuilder
		.setPrimitiveTopology		  (VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
		.setRenderSize				  (renderSize)
		.setPatchControlPoints		  (1)
		.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				context.getBinaryCollection().get("frag"), DE_NULL);

	if (isTessellationStage(flags))
		pipelineBuilder
			.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
			.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL);

	if (isGeometryStage(flags))
		pipelineBuilder
			.setShader				  (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				context.getBinaryCollection().get("geom"), DE_NULL);

	const Unique<VkPipeline> pipeline(pipelineBuilder.build(vk, device, *pipelineLayout, *renderPass));

	// Draw commands

	beginCommandBuffer(vk, *cmdBuffer);

	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);

	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		const Allocation& alloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), colorBufferSizeBytes);
		tcu::ConstPixelBufferAccess image(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, alloc.getHostPtr());

		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::LogImage("color0", "", image);

		if (verifyImage(log, image, expectedPointSize))
			return tcu::TestStatus::pass("OK");
		else
			return tcu::TestStatus::fail("Didn't render expected point");
	}
}